

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UFFAtomTypesSectionParser.cpp
# Opt level: O2

void __thiscall
OpenMD::UFFAtomTypesSectionParser::validateSection
          (UFFAtomTypesSectionParser *this,ForceField *param_1)

{
  return;
}

Assistant:

void UFFAtomTypesSectionParser::validateSection(ForceField&) {
    // ForceField::AtomTypeContainer* atomTypes = ff.getAtomTypes();
    // ForceField::AtomTypeContainer::MapTypeIterator i;
    // AtomType* at;

    // std::vector<AtomType*> uffTypes;

    // for (at = atomTypes->beginType(i); at != NULL; at =
    // atomTypes->nextType(i))
    // {

    //   UFFAdapter uffa = UFFAdapter(at);
    //   if (uffa.isUFF())
    //     uffTypes.push_back(at);
    // }

    // for (std::size_t i = 0; i < uffTypes.size(); ++i) {
    //   RealType ri = uffTypes[i]->getR1();
    //   RealType chiI = uffTypes[i]->getXi();
    //   RealType Ra = uffTypes[i]->getX1();
    //   RealType ka = uffTypes[i]->getD1();

    //   for (std::size_t j = 0; j < uffTypes.size(); ++j) {
    //     RealType rj = uffTypes[j]->getR1();
    //     RealType chiJ = uffTypes[j]->getXi();
    //     RealType Rb = uffTypes[j]->getX1();
    //     RealType kb = uffTypes[j]->getD1();

    //     // Precompute the equilibrium bond distance
    //     // From equation 3
    //     rbo = -0.1332*(ri+rj)*log(bondorder);
    //     // From equation 4
    //     ren = ri*rj*(pow((sqrt(chiI) - sqrt(chiJ)),2.0)) / (chiI*ri +
    //     chiJ*rj);
    //     // From equation 2
    //     // NOTE: See http://towhee.sourceforge.net/forcefields/uff.html
    //     // There is a typo in the published paper
    //     rij = ri + rj + rbo - ren;

    //     kab = sqrt(ka * kb);

    //     // ka now represents the xij in equation 20 -- the expected vdw
    //     distance kaSquared = (Ra * Rb); ka = sqrt(kaSquared);
  }